

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algebraic_simplification.hpp
# Opt level: O0

uint32_t __thiscall
optimization::algebraic_simplification::AlgebraicSimplification::getNewVar
          (AlgebraicSimplification *this,MirFunction *func)

{
  bool bVar1;
  pair<unsigned_int,_mir::inst::Variable> *__x;
  long in_RSI;
  pair<const_unsigned_int,_mir::inst::Variable> *var;
  iterator __end2;
  iterator __begin2;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *__range2;
  uint32_t maxId;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  pair<unsigned_int,_mir::inst::Variable> *in_stack_ffffffffffffff20;
  Variable *this_00;
  Variable local_a0 [3];
  reference local_38;
  _Self local_30;
  _Self local_28;
  long local_20;
  uint local_14;
  long local_10;
  
  local_14 = 1;
  local_20 = in_RSI + 0x38;
  local_10 = in_RSI;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
       ::begin((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
       ::end((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
              *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  while( true ) {
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    local_38 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::
               operator*((_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_> *)
                         0x1a0db8);
    if (local_14 < local_38->first) {
      local_14 = local_38->first;
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_> *)
               in_stack_ffffffffffffff20);
  }
  __x = (pair<unsigned_int,_mir::inst::Variable> *)(local_10 + 0x38);
  local_14 = local_14 + 1;
  this_00 = local_a0;
  std::make_shared<mir::types::IntTy>();
  std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
            ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffff20,
             (shared_ptr<mir::types::IntTy> *)
             CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  mir::inst::Variable::Variable
            (this_00,(SharedTyPtr *)__x,SUB81((ulong)in_stack_ffffffffffffff20 >> 0x38,0),
             SUB81((ulong)in_stack_ffffffffffffff20 >> 0x30,0),
             SUB81((ulong)in_stack_ffffffffffffff20 >> 0x28,0));
  std::pair<unsigned_int,_mir::inst::Variable>::pair<unsigned_int_&,_mir::inst::Variable,_true>
            (in_stack_ffffffffffffff20,
             (uint *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
             (Variable *)0x1a0e6f);
  std::
  map<unsigned_int,mir::inst::Variable,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
  ::insert<std::pair<unsigned_int,mir::inst::Variable>>
            ((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
              *)this_00,__x);
  std::pair<unsigned_int,_mir::inst::Variable>::~pair
            ((pair<unsigned_int,_mir::inst::Variable> *)0x1a0ead);
  mir::inst::Variable::~Variable((Variable *)0x1a0eb7);
  std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x1a0ec1);
  std::shared_ptr<mir::types::IntTy>::~shared_ptr((shared_ptr<mir::types::IntTy> *)0x1a0ecb);
  return local_14;
}

Assistant:

uint32_t getNewVar(mir::inst::MirFunction& func) {
    uint32_t maxId = 1;
    for (auto& var : func.variables) {
      if (var.first > maxId) {
        maxId = var.first;
      }
    }
    func.variables.insert(std::pair<uint32_t, mir::inst::Variable>(
        ++maxId, mir::inst::Variable(mir::types::SharedTyPtr(
                                         std::make_shared<mir::types::IntTy>()),
                                     false, true)));
    return maxId;
  }